

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_common.cc
# Opt level: O0

void google::protobuf::compiler::java::SetCommonFieldVariables
               (FieldDescriptor *descriptor,FieldGeneratorInfo *info,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  *this;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pfVar1;
  bool bVar2;
  int x;
  Type TVar3;
  JavaType JVar4;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar5;
  Descriptor *pDVar6;
  string *psVar7;
  AlphaNum *pAVar8;
  AlphaNum *in_RCX;
  bool jvm_dsl;
  FieldDescriptor *field;
  AlphaNum *a;
  AlphaNum *in_R8;
  string_view field_name;
  string_view field_name_00;
  string_view sVar9;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_580;
  AlphaNum local_568;
  AlphaNum *local_538;
  char *local_530;
  AlphaNum local_528;
  string local_4f8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d8;
  AlphaNum local_4a8;
  AlphaNum *local_478;
  char *local_470;
  AlphaNum local_468;
  string local_438;
  AlphaNum local_418;
  AlphaNum *local_3e8;
  char *local_3e0;
  AlphaNum local_3d8;
  string local_3a8;
  allocator<char> local_381;
  string_view local_380;
  string local_370 [32];
  string local_350;
  AlphaNum local_330;
  AlphaNum local_300;
  undefined1 local_2d0 [16];
  string local_2c0;
  AlphaNum local_2a0;
  AlphaNum local_270;
  AlphaNum local_240;
  undefined1 local_210 [16];
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [8];
  string kt_property_name;
  AlphaNum local_170;
  undefined1 local_140 [16];
  string local_130;
  AlphaNum local_110;
  string local_e0;
  string local_c0;
  allocator<char> local_99;
  string_view local_98;
  string local_88 [55];
  allocator<char> local_51;
  string_view local_50;
  string local_40 [32];
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  *local_20;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  FieldGeneratorInfo *info_local;
  FieldDescriptor *descriptor_local;
  
  local_20 = (raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)variables;
  variables_local =
       (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)info;
  info_local = (FieldGeneratorInfo *)descriptor;
  local_50 = FieldDescriptor::name(descriptor);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_40,&local_50,&local_51);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[11]> *)0xaa5115);
  std::__cxx11::string::operator=((string *)pbVar5,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_51);
  pfVar1 = variables_local;
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[5]> *)0xc259cc);
  std::__cxx11::string::operator=((string *)pbVar5,(string *)pfVar1);
  pDVar6 = FieldDescriptor::containing_type((FieldDescriptor *)info_local);
  local_98 = Descriptor::name(pDVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_88,&local_98,&local_99);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[10]> *)0xa117a7);
  std::__cxx11::string::operator=((string *)pbVar5,local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_99);
  psVar7 = (string *)(variables_local + 1);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[17],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[17]> *)0xaa4e7b);
  std::__cxx11::string::operator=((string *)pbVar5,psVar7);
  psVar7 = (string *)(variables_local + 2);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[21],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[21]> *)"disambiguated_reason");
  std::__cxx11::string::operator=((string *)pbVar5,psVar7);
  FieldConstantName_abi_cxx11_(&local_c0,(java *)info_local,field);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[14]> *)0xa8db1a);
  std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  x = FieldDescriptor::number((FieldDescriptor *)info_local);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_110,x);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_e0,(lts_20250127 *)&local_110,a);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[7]> *)0xbe447d);
  std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[15],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[15]> *)"kt_dsl_builder");
  std::__cxx11::string::operator=((string *)pbVar5,"_builder");
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[2],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[2]> *)0xa24ff9);
  std::__cxx11::string::operator=((string *)pbVar5,"");
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[2],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[2]> *)0xb17fa7);
  std::__cxx11::string::operator=((string *)pbVar5,"");
  local_140 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)variables_local);
  sVar9._M_str = local_140._8_8_;
  sVar9._M_len = (size_t)sVar9._M_str;
  bVar2 = IsForbiddenKotlin(local_140._0_8_,sVar9);
  if (bVar2) {
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)variables_local)
    ;
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)((long)&kt_property_name.field_2 + 8),"_");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_130,(lts_20250127 *)&local_170,
               (AlphaNum *)((long)&kt_property_name.field_2 + 8),in_RCX);
  }
  else {
    std::__cxx11::string::string((string *)&local_130,(string *)variables_local);
  }
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[8],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[8]> *)"kt_name");
  std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_1e0,(string *)(variables_local + 1));
  GetKotlinPropertyName((string *)local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[17],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[17]> *)"kt_property_name");
  std::__cxx11::string::operator=((string *)pbVar5,(string *)local_1c0);
  local_210 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1c0);
  field_name._M_str = local_210._8_8_;
  field_name._M_len = (size_t)field_name._M_str;
  bVar2 = IsForbiddenKotlin(local_210._0_8_,field_name);
  if (bVar2) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_240,"`");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_270,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_2a0,"`");
    in_RCX = &local_2a0;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_200,(lts_20250127 *)&local_240,&local_270,in_RCX,in_R8);
  }
  else {
    std::__cxx11::string::string((string *)&local_200,(string *)local_1c0);
  }
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[13]> *)"kt_safe_name");
  std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  local_2d0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)variables_local);
  field_name_00._M_str = local_2d0._8_8_;
  field_name_00._M_len = (size_t)field_name_00._M_str;
  bVar2 = IsForbiddenKotlin(local_2d0._0_8_,field_name_00);
  if (bVar2) {
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_300,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (variables_local + 1));
    absl::lts_20250127::AlphaNum::AlphaNum(&local_330,"_");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_2c0,(lts_20250127 *)&local_300,&local_330,in_RCX);
  }
  else {
    std::__cxx11::string::string((string *)&local_2c0,(string *)(variables_local + 1));
  }
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[20],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[20]> *)"kt_capitalized_name");
  std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  JvmSynthetic_abi_cxx11_
            (&local_350,
             (java *)(ulong)(*(byte *)((long)&variables_local[5].
                                              super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              .
                                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              .settings_.
                                              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                              .
                                              super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                              .value.size_ + 1) & 1),jvm_dsl);
  pbVar5 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     (local_20,(key_arg<char[14]> *)"jvm_synthetic");
  std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)info_local);
  if (!bVar2) {
    TVar3 = FieldDescriptor::type((FieldDescriptor *)info_local);
    local_380 = FieldTypeName(TVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_370,&local_380,&local_381);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[22],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (local_20,(key_arg<char[22]> *)"annotation_field_type");
    std::__cxx11::string::operator=((string *)pbVar5,local_370);
    std::__cxx11::string::~string(local_370);
    std::allocator<char>::~allocator(&local_381);
    goto LAB_004efbd8;
  }
  JVar4 = GetJavaType((FieldDescriptor *)info_local);
  if (JVar4 == JAVATYPE_MESSAGE) {
    pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)info_local);
    bVar2 = IsMapEntry(pDVar6);
    if (!bVar2) goto LAB_004ef9a0;
    TVar3 = FieldDescriptor::type((FieldDescriptor *)info_local);
    sVar9 = FieldTypeName(TVar3);
    local_3e0 = sVar9._M_str;
    pAVar8 = (AlphaNum *)sVar9._M_len;
    local_3e8 = pAVar8;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_3d8,sVar9);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_418,"MAP");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_3a8,(lts_20250127 *)&local_3d8,&local_418,pAVar8);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[22],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (local_20,(key_arg<char[22]> *)"annotation_field_type");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
  }
  else {
LAB_004ef9a0:
    TVar3 = FieldDescriptor::type((FieldDescriptor *)info_local);
    sVar9 = FieldTypeName(TVar3);
    local_470 = sVar9._M_str;
    pAVar8 = (AlphaNum *)sVar9._M_len;
    local_478 = pAVar8;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_468,sVar9);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_4a8,"_LIST");
    absl::lts_20250127::StrCat_abi_cxx11_(&local_438,(lts_20250127 *)&local_468,&local_4a8,pAVar8);
    pbVar5 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[22],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       (local_20,(key_arg<char[22]> *)"annotation_field_type");
    std::__cxx11::string::operator=((string *)pbVar5,(string *)&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    bVar2 = FieldDescriptor::is_packed((FieldDescriptor *)info_local);
    this = local_20;
    if (bVar2) {
      TVar3 = FieldDescriptor::type((FieldDescriptor *)info_local);
      sVar9 = FieldTypeName(TVar3);
      local_530 = sVar9._M_str;
      pAVar8 = (AlphaNum *)sVar9._M_len;
      local_538 = pAVar8;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_528,sVar9);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_568,"_LIST_PACKED");
      absl::lts_20250127::StrCat_abi_cxx11_(&local_4f8,(lts_20250127 *)&local_528,&local_568,pAVar8)
      ;
      std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[22],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_4d8,(char (*) [22])"annotation_field_type",&local_4f8);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::insert(&local_580,
               (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this,&local_4d8);
      std::
      pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_4d8);
      std::__cxx11::string::~string((string *)&local_4f8);
    }
  }
LAB_004efbd8:
  std::__cxx11::string::~string((string *)local_1c0);
  return;
}

Assistant:

void SetCommonFieldVariables(
    const FieldDescriptor* descriptor, const FieldGeneratorInfo* info,
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  (*variables)["field_name"] = std::string(descriptor->name());
  (*variables)["name"] = info->name;
  (*variables)["classname"] =
      std::string(descriptor->containing_type()->name());
  (*variables)["capitalized_name"] = info->capitalized_name;
  (*variables)["disambiguated_reason"] = info->disambiguated_reason;
  (*variables)["constant_name"] = FieldConstantName(descriptor);
  (*variables)["number"] = absl::StrCat(descriptor->number());
  (*variables)["kt_dsl_builder"] = "_builder";
  // These variables are placeholders to pick out the beginning and ends of
  // identifiers for annotations (when doing so with existing variables would
  // be ambiguous or impossible). They should never be set to anything but the
  // empty string.
  (*variables)["{"] = "";
  (*variables)["}"] = "";
  (*variables)["kt_name"] = IsForbiddenKotlin(info->name)
                                ? absl::StrCat(info->name, "_")
                                : info->name;
  auto kt_property_name = GetKotlinPropertyName(info->capitalized_name);
  (*variables)["kt_property_name"] = kt_property_name;
  (*variables)["kt_safe_name"] = IsForbiddenKotlin(kt_property_name)
                                     ? absl::StrCat("`", kt_property_name, "`")
                                     : kt_property_name;
  (*variables)["kt_capitalized_name"] =
      IsForbiddenKotlin(info->name) ? absl::StrCat(info->capitalized_name, "_")
                                    : info->capitalized_name;
  (*variables)["jvm_synthetic"] = JvmSynthetic(info->options.jvm_dsl);
  if (!descriptor->is_repeated()) {
    (*variables)["annotation_field_type"] =
        std::string(FieldTypeName(descriptor->type()));
  } else if (GetJavaType(descriptor) == JAVATYPE_MESSAGE &&
             IsMapEntry(descriptor->message_type())) {
    (*variables)["annotation_field_type"] =
        absl::StrCat(FieldTypeName(descriptor->type()), "MAP");
  } else {
    (*variables)["annotation_field_type"] =
        absl::StrCat(FieldTypeName(descriptor->type()), "_LIST");
    if (descriptor->is_packed()) {
      variables->insert(
          {"annotation_field_type",
           absl::StrCat(FieldTypeName(descriptor->type()), "_LIST_PACKED")});
    }
  }
}